

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int N_VInvTest_Serial(N_Vector x,N_Vector z)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  lVar2 = *x->content;
  if (0 < lVar2) {
    lVar3 = *(long *)((long)x->content + 0x10);
    lVar4 = *(long *)((long)z->content + 0x10);
    iVar7 = 1;
    lVar6 = 0;
    do {
      dVar1 = *(double *)(lVar3 + lVar6 * 8);
      if ((dVar1 != 0.0) || (iVar5 = 0, NAN(dVar1))) {
        *(double *)(lVar4 + lVar6 * 8) = 1.0 / dVar1;
        iVar5 = iVar7;
      }
      iVar7 = iVar5;
      lVar6 = lVar6 + 1;
    } while (lVar2 != lVar6);
    return iVar7;
  }
  return 1;
}

Assistant:

sunbooleantype N_VInvTest_Serial(N_Vector x, N_Vector z)
{
  sunindextype i, N;
  sunrealtype *xd, *zd;
  sunbooleantype no_zero_found;

  xd = zd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  zd = NV_DATA_S(z);

  no_zero_found = SUNTRUE;
  for (i = 0; i < N; i++)
  {
    if (xd[i] == ZERO) { no_zero_found = SUNFALSE; }
    else { zd[i] = ONE / xd[i]; }
  }

  return no_zero_found;
}